

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_reader_init_file_v2
                  (mz_zip_archive *pZip,char *pFilename,mz_uint flags,mz_uint64 file_start_ofs,
                  mz_uint64 archive_size)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  int iVar3;
  FILE *__stream;
  
  if ((pFilename == (char *)0x0 || pZip == (mz_zip_archive *)0x0) || (archive_size - 1 < 0x15)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
  }
  else {
    __stream = fopen(pFilename,"rb");
    if (__stream == (FILE *)0x0) {
      pZip->m_last_error = MZ_ZIP_FILE_OPEN_FAILED;
    }
    else {
      if (archive_size == 0) {
        iVar3 = fseeko(__stream,0,2);
        if (iVar3 != 0) {
          fclose(__stream);
          pZip->m_last_error = MZ_ZIP_FILE_SEEK_FAILED;
          return 0;
        }
        archive_size = ftello(__stream);
      }
      if (archive_size < 0x16) {
        fclose(__stream);
        pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
      }
      else {
        mVar2 = mz_zip_reader_init_internal(pZip,flags);
        if (mVar2 != 0) {
          pZip->m_zip_type = MZ_ZIP_TYPE_FILE;
          pZip->m_pRead = mz_zip_file_read_func;
          pZip->m_pIO_opaque = pZip;
          pmVar1 = pZip->m_pState;
          pmVar1->m_pFile = (FILE *)__stream;
          pZip->m_archive_size = archive_size;
          pmVar1->m_file_archive_start_ofs = file_start_ofs;
          mVar2 = mz_zip_reader_read_central_dir(pZip,flags);
          if (mVar2 == 0) {
            mz_zip_reader_end_internal(pZip,0);
            return 0;
          }
          return 1;
        }
        fclose(__stream);
      }
    }
  }
  return 0;
}

Assistant:

mz_bool mz_zip_reader_init_file_v2(mz_zip_archive *pZip, const char *pFilename, mz_uint flags, mz_uint64 file_start_ofs, mz_uint64 archive_size)
{
    mz_uint64 file_size;
    MZ_FILE *pFile;

    if ((!pZip) || (!pFilename) || ((archive_size) && (archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pFile = MZ_FOPEN(pFilename, "rb");
    if (!pFile)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);

    file_size = archive_size;
    if (!file_size)
    {
        if (MZ_FSEEK64(pFile, 0, SEEK_END))
        {
            MZ_FCLOSE(pFile);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_SEEK_FAILED);
        }

        file_size = MZ_FTELL64(pFile);
    }

    /* TODO: Better sanity check archive_size and the # of actual remaining bytes */

    if (file_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    {
	MZ_FCLOSE(pFile);
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);
    }

    if (!mz_zip_reader_init_internal(pZip, flags))
    {
        MZ_FCLOSE(pFile);
        return MZ_FALSE;
    }

    pZip->m_zip_type = MZ_ZIP_TYPE_FILE;
    pZip->m_pRead = mz_zip_file_read_func;
    pZip->m_pIO_opaque = pZip;
    pZip->m_pState->m_pFile = pFile;
    pZip->m_archive_size = file_size;
    pZip->m_pState->m_file_archive_start_ofs = file_start_ofs;

    if (!mz_zip_reader_read_central_dir(pZip, flags))
    {
        mz_zip_reader_end_internal(pZip, MZ_FALSE);
        return MZ_FALSE;
    }

    return MZ_TRUE;
}